

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diskdata.c
# Opt level: O2

void dd_Init(void)

{
  int iVar1;
  FILE *pFVar2;
  undefined1 auVar3 [16];
  int number;
  char buffer [1024];
  
  pFVar2 = OpenDataFile("r");
  if (pFVar2 != (FILE *)0x0) {
    while( true ) {
      iVar1 = __isoc99_fscanf(pFVar2,"%s%d",buffer,&number);
      if (iVar1 == -1) break;
      iVar1 = bcmp(buffer,"hiscore:",9);
      if (iVar1 == 0) {
        StoredData.m_highScore = number;
      }
      else {
        auVar3[0] = -(buffer[0] == 'c');
        auVar3[1] = -(buffer[1] == 'o');
        auVar3[2] = -(buffer[2] == 'l');
        auVar3[3] = -(buffer[3] == 'o');
        auVar3[4] = -(buffer[4] == 'r');
        auVar3[5] = -(buffer[5] == 's');
        auVar3[6] = -(buffer[6] == 'c');
        auVar3[7] = -(buffer[7] == 'h');
        auVar3[8] = -(buffer[8] == 'e');
        auVar3[9] = -(buffer[9] == 'm');
        auVar3[10] = -(buffer[10] == 'e');
        auVar3[0xb] = -(buffer[0xb] == 'i');
        auVar3[0xc] = -(buffer[0xc] == 'd');
        auVar3[0xd] = -(buffer[0xd] == 'x');
        auVar3[0xe] = -(buffer[0xe] == ':');
        auVar3[0xf] = -(buffer[0xf] == '\0');
        if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                    (ushort)(auVar3[0xf] >> 7) << 0xf) == 0xffff) {
          StoredData.m_colorScheme1 = number;
        }
        else {
          iVar1 = bcmp(buffer,"colorscheme2idx:",0x11);
          if (iVar1 == 0) {
            StoredData.m_colorScheme2 = number;
          }
        }
      }
    }
    ActiveData.m_colorScheme2 = StoredData.m_colorScheme2;
    ActiveData.m_colorScheme1 = StoredData.m_colorScheme1;
    ActiveData.m_highScore = StoredData.m_highScore;
  }
  return;
}

Assistant:

void dd_Init(void)
{
  char buffer[1024];
  int number;
  FILE* fp = OpenDataFile("r");

  if (fp) {
    while (fscanf(fp, "%s%d", buffer, &number) != EOF) {
      if (strcmp(buffer, HighScoreLabel) == RET_OK) {
        StoredData.m_highScore = number;
      } else if (strcmp(buffer, ColorScheme1IdxLabel) == RET_OK) {
        StoredData.m_colorScheme1 = number;
      } else if (strcmp(buffer, ColorScheme2IdxLabel) == RET_OK) {
        StoredData.m_colorScheme2 = number;
      }
    }
    ActiveData = StoredData;
  }
}